

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::CustomModel::~CustomModel(CustomModel *this)

{
  ~CustomModel(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

CustomModel::~CustomModel() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.CustomModel)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}